

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp:387:49)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_global_object_cpp:387:49)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  string *s;
  value *a;
  pointer v;
  
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start; v != pvVar1; v = v + 1) {
    if (v->type_ == string) {
      s = value::string_value(v);
      mjs::operator<<((wostream *)&std::wcout,s);
    }
    else {
      debug_print((wostream *)&std::wcout,v,4,0x7fffffff,0);
    }
    std::operator<<((wostream *)&std::wcout,' ');
  }
  std::operator<<((wostream *)&std::wcout,'\n');
  value::value(__return_storage_ptr__,(value *)&value::undefined);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }